

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O2

int __thiscall FatSystem::readData(FatSystem *this,unsigned_long_long address,char *buffer,int size)

{
  int iVar1;
  ostream *poVar2;
  ssize_t sVar3;
  uint uVar4;
  
  if ((this->totalSize != 0xffffffffffffffff) && (this->totalSize < (long)size + address)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"! Trying to read outside the disk");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  uVar4 = 0;
  lseek64(this->fd,address + this->globalOffset,0);
  do {
    sVar3 = read(this->fd,buffer + uVar4,(long)size);
    iVar1 = (int)sVar3;
    if (iVar1 < 1) {
      return iVar1;
    }
    size = size - iVar1;
    uVar4 = uVar4 + iVar1;
  } while (0 < size);
  return iVar1;
}

Assistant:

int FatSystem::readData(unsigned long long address, char *buffer, int size)
{
    if (totalSize != -1 && address+size > totalSize) {
        cerr << "! Trying to read outside the disk" << endl;
    }

    lseek64(fd, globalOffset+address, SEEK_SET);

    int n;
    int pos = 0;
    do {
        n = read(fd, buffer+pos, size);

        if (n > 0) {
            pos += n;
            size -= n;
        }
    } while ((size>0) && (n>0));

    return n;
}